

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_45a12::MapDriver::annotationHintWasTaken(MapDriver *this)

{
  long *in_RDI;
  float fVar1;
  Vec3 VVar2;
  Vec3 pp;
  Vec3 ss;
  Vec3 ff;
  float r;
  Color *color;
  Vec3 *endPoint;
  Vec3 *in_stack_fffffffffffffce8;
  Vec3 *v;
  Vec3 *in_stack_fffffffffffffcf0;
  AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *this_00;
  Vec3 local_108 [9];
  Vec3 local_98;
  Vec3 local_88;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  undefined1 local_58 [72];
  float local_10;
  float local_c;
  
  if ((*(byte *)(in_RDI + 0x25) & 1) == 0) {
    *(int *)((long)in_RDI + 0x164) = *(int *)((long)in_RDI + 0x164) + 1;
  }
  fVar1 = 0.9;
  local_c = *(float *)(in_RDI + 0x20) * 0.9;
  local_58._32_8_ = (**(code **)(*in_RDI + 0x30))();
  local_58._40_4_ = fVar1;
  local_58._48_8_ = local_58._32_8_;
  local_58._56_4_ = fVar1;
  local_58._16_12_ =
       (undefined1  [12])
       OpenSteer::Vec3::operator*
                 (in_stack_fffffffffffffcf0,(float)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  fVar1 = local_58._24_4_;
  local_58._64_8_ = local_58._16_8_;
  local_10 = fVar1;
  local_78 = (**(code **)(*in_RDI + 0x10))();
  local_70 = fVar1;
  local_68 = local_78;
  local_60 = fVar1;
  VVar2 = OpenSteer::Vec3::operator*
                    (in_stack_fffffffffffffcf0,(float)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  local_58._8_4_ = VVar2.z;
  local_88._0_8_ = VVar2._0_8_;
  local_58._0_4_ = local_88.x;
  local_58._4_4_ = local_88.y;
  local_88 = VVar2;
  (**(code **)(*in_RDI + 0x40))();
  (**(code **)(*in_RDI + 0x20))();
  OpenSteer::Vec3::operator*
            (in_stack_fffffffffffffcf0,(float)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  VVar2 = OpenSteer::Vec3::operator+(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  local_108[0].z = VVar2.z;
  local_98.z = local_108[0].z;
  local_108[0]._0_8_ = VVar2._0_8_;
  local_98.x = local_108[0].x;
  local_98.y = local_108[0].y;
  endPoint = &local_98;
  v = (Vec3 *)(local_58 + 0x40);
  OpenSteer::Vec3::operator+(in_stack_fffffffffffffcf0,v);
  this_00 = (AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)local_58;
  OpenSteer::Vec3::operator+((Vec3 *)this_00,v);
  OpenSteer::Vec3::operator-((Vec3 *)this_00,v);
  OpenSteer::Vec3::operator+((Vec3 *)this_00,v);
  color = (Color *)&OpenSteer::gWhite;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine(this_00,v,endPoint,(Color *)&OpenSteer::gWhite);
  OpenSteer::Vec3::operator-((Vec3 *)this_00,v);
  OpenSteer::Vec3::operator-((Vec3 *)this_00,v);
  OpenSteer::Vec3::operator-((Vec3 *)this_00,v);
  OpenSteer::Vec3::operator+((Vec3 *)this_00,v);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine(this_00,v,endPoint,color);
  OpenSteer::Vec3::operator-((Vec3 *)this_00,v);
  OpenSteer::Vec3::operator-((Vec3 *)this_00,v);
  OpenSteer::Vec3::operator+((Vec3 *)this_00,v);
  OpenSteer::Vec3::operator-((Vec3 *)this_00,v);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine(this_00,v,endPoint,color);
  OpenSteer::Vec3::operator+((Vec3 *)this_00,v);
  OpenSteer::Vec3::operator+((Vec3 *)this_00,v);
  OpenSteer::Vec3::operator+((Vec3 *)this_00,v);
  OpenSteer::Vec3::operator-((Vec3 *)this_00,v);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine(this_00,v,endPoint,color);
  return;
}

Assistant:

void annotationHintWasTaken (void)
        {
            if (!dtZero) hintTakenCount++;

            const float r = halfWidth * 0.9f;
            const Vec3 ff = forward () * r;
            const Vec3 ss = side () * r;
            const Vec3 pp = position () + (up () * 0.2f);
            annotationLine (pp + ff + ss, pp - ff + ss, gWhite);
            annotationLine (pp - ff - ss, pp - ff + ss, gWhite);
            annotationLine (pp - ff - ss, pp + ff - ss, gWhite);
            annotationLine (pp + ff + ss, pp + ff - ss, gWhite);

            //OpenSteerDemo::clock.setPausedState (true);
        }